

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O1

void __thiscall
helics::apps::Clone::captureForCurrentTime(Clone *this,Time currentTime,int iteration)

{
  int iVar1;
  _Elt_pointer pIVar2;
  pointer piVar3;
  long lVar4;
  bool bVar5;
  mapped_type *pmVar6;
  string *psVar7;
  logger *this_00;
  long lVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  _Elt_pointer pIVar9;
  _Elt_pointer this_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  int subid;
  string valstr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  TimeRepresentation<count_time<9,_long>_> local_f8;
  mapped_type local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  _Alloc_hider _Stack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_90;
  string local_88;
  _Map_pointer local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  vector<helics::apps::Clone::ValueCapture,std::allocator<helics::apps::Clone::ValueCapture>>
  *local_40;
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  *local_38;
  
  this_01 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  pIVar2 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_f8.internalTimeCode = currentTime.internalTimeCode;
  if (this_01 != pIVar2) {
    pIVar9 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    local_68 = (this->subscriptions).
               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    local_38 = &this->subids;
    local_40 = (vector<helics::apps::Clone::ValueCapture,std::allocator<helics::apps::Clone::ValueCapture>>
                *)&this->points;
    do {
      bVar5 = Input::isUpdated(this_01);
      if (bVar5) {
        Input::getValue_impl<std::__cxx11::string>(&local_60,this_01);
        local_c8._0_4_ = (this_01->super_Interface).handle.hid;
        pmVar6 = CLI::std::
                 map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
                 ::operator[](local_38,(key_type *)local_c8);
        local_ec = *pmVar6;
        std::
        vector<helics::apps::Clone::ValueCapture,std::allocator<helics::apps::Clone::ValueCapture>>
        ::emplace_back<TimeRepresentation<count_time<9,long>>&,int_const&,std::__cxx11::string&>
                  (local_40,&local_f8,&local_ec,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
        if (0 < iteration) {
          (this->points).
          super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].iteration = (int16_t)iteration;
        }
        if (this->verbose == true) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          local_e8._M_string_length = 0;
          local_e8.field_2._M_local_buf[0] = '\0';
          psVar7 = &this_01->givenTarget;
          if ((ulong)local_60._8_8_ <
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x96) {
            if (iteration < 1) {
              lVar4 = local_f8.internalTimeCode / 1000000000;
              lVar8 = local_f8.internalTimeCode % 1000000000;
              if ((this_01->givenTarget)._M_string_length == 0) {
                psVar7 = Interface::getSourceTargets_abi_cxx11_(&this_01->super_Interface);
              }
              local_c8._0_8_ = (double)lVar8 * 1e-09 + (double)lVar4;
              local_b8 = (psVar7->_M_dataplus)._M_p;
              _Stack_b0._M_p = (pointer)psVar7->_M_string_length;
              local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_60._M_allocated_capacity;
              aStack_a0._M_allocated_capacity = local_60._8_8_;
              fmt_01.size_ = 0xdda;
              fmt_01.data_ = (char *)0xf;
              args_01.field_1.values_ = in_R9.values_;
              args_01.desc_ = (unsigned_long_long)local_c8;
              ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)"[{}]value {}={}",fmt_01,args_01);
            }
            else {
              lVar4 = local_f8.internalTimeCode / 1000000000;
              lVar8 = local_f8.internalTimeCode % 1000000000;
              if ((this_01->givenTarget)._M_string_length == 0) {
                psVar7 = Interface::getSourceTargets_abi_cxx11_(&this_01->super_Interface);
              }
              local_c8._0_8_ = (double)lVar8 * 1e-09 + (double)lVar4;
              local_b8 = (pointer)CONCAT44(local_b8._4_4_,iteration);
              local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(psVar7->_M_dataplus)._M_p;
              aStack_a0._M_allocated_capacity = psVar7->_M_string_length;
              aStack_a0._8_8_ = local_60._M_allocated_capacity;
              paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_60._8_8_;
              fmt.size_ = 0xdd1a;
              fmt.data_ = (char *)0x12;
              args.field_1.values_ = in_R9.values_;
              args.desc_ = (unsigned_long_long)local_c8;
              ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)"[{}:{}]value {}={}",fmt,args);
            }
          }
          else if (iteration < 1) {
            lVar4 = local_f8.internalTimeCode / 1000000000;
            lVar8 = local_f8.internalTimeCode % 1000000000;
            if ((this_01->givenTarget)._M_string_length == 0) {
              psVar7 = Interface::getSourceTargets_abi_cxx11_(&this_01->super_Interface);
            }
            local_c8._0_8_ = (double)lVar8 * 1e-09 + (double)lVar4;
            local_b8 = (psVar7->_M_dataplus)._M_p;
            _Stack_b0._M_p = (pointer)psVar7->_M_string_length;
            local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_60._8_8_;
            fmt_02.size_ = 0x4da;
            fmt_02.data_ = (char *)0x16;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)local_c8;
            ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)"[{}]value {}=block[{}]",fmt_02,args_02)
            ;
          }
          else {
            lVar4 = local_f8.internalTimeCode / 1000000000;
            lVar8 = local_f8.internalTimeCode % 1000000000;
            if ((this_01->givenTarget)._M_string_length == 0) {
              psVar7 = Interface::getSourceTargets_abi_cxx11_(&this_01->super_Interface);
            }
            local_c8._0_8_ = (double)lVar8 * 1e-09 + (double)lVar4;
            local_b8 = (pointer)CONCAT44(local_b8._4_4_,iteration);
            local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(psVar7->_M_dataplus)._M_p;
            aStack_a0._M_allocated_capacity = psVar7->_M_string_length;
            aStack_a0._8_8_ = local_60._8_8_;
            fmt_00.size_ = 0x4d1a;
            fmt_00.data_ = (char *)0x19;
            args_00.field_1.values_ = in_R9.values_;
            args_00.desc_ = (unsigned_long_long)local_c8;
            ::fmt::v11::vformat_abi_cxx11_
                      (&local_88,(v11 *)"[{}:{}]value {}=block[{}]",fmt_00,args_00);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_e8,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          this_00 = spdlog::default_logger_raw();
          local_c8._0_8_ = (Message *)0x0;
          local_c8._8_8_ = (Core *)0x0;
          local_b8._0_4_ = 0;
          local_b8._4_4_ = 0;
          spdlog::logger::log(this_00,0.0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,
                            CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                     local_e8.field_2._M_local_buf[0]) + 1);
          }
        }
        piVar3 = (this->pubPointCount).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[local_ec];
        if (iVar1 == 0) {
          (this->points).
          super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].first = true;
        }
        piVar3[local_ec] = iVar1 + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_allocated_capacity != &local_50) {
          operator_delete((void *)local_60._M_allocated_capacity,local_50._M_allocated_capacity + 1)
          ;
        }
      }
      this_01 = this_01 + 1;
      if (this_01 == pIVar9) {
        this_01 = local_68[1];
        local_68 = local_68 + 1;
        pIVar9 = this_01 + 1;
      }
    } while (this_01 != pIVar2);
  }
  if (((this->cloneEndpoint)._M_t.
       super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
       super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
       super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl != (Endpoint *)0x0) &&
     (bVar5 = Endpoint::hasMessage
                        ((this->cloneEndpoint)._M_t.
                         super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>
                         .super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl), bVar5)) {
    do {
      Endpoint::getMessage((Endpoint *)local_c8);
      std::
      vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
      ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
                ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
                  *)&this->messages,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)local_c8);
      if ((Message *)local_c8._0_8_ != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)local_c8,(Message *)local_c8._0_8_);
      }
      bVar5 = Endpoint::hasMessage
                        ((this->cloneEndpoint)._M_t.
                         super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>
                         .super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl);
    } while (bVar5);
  }
  return;
}

Assistant:

void Clone::captureForCurrentTime(Time currentTime, int iteration)
{
    for (auto& sub : subscriptions) {
        if (sub.isUpdated()) {
            auto val = sub.getValue<std::string>();
            const int subid = subids[sub.getHandle()];
            points.emplace_back(currentTime, subid, val);
            if (iteration > 0) {
                points.back().iteration = iteration;
            }
            if (verbose) {
                std::string valstr;
                if (val.size() < 150) {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val);
                    } else {
                        valstr = fmt::format("[{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val);
                    }
                } else {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val.size());
                    } else {
                        valstr = fmt::format("[{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val.size());
                    }
                }
                spdlog::info(valstr);
            }
            if (pubPointCount[subid] == 0) {
                points.back().first = true;
            }
            ++pubPointCount[subid];
        }
    }

    // get the clone endpoints
    if (cloneEndpoint) {
        while (cloneEndpoint->hasMessage()) {
            messages.push_back(cloneEndpoint->getMessage());
        }
    }
}